

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::BVHNIntersector1<4,_1,_true,_embree::sse2::SubdivPatch1Intersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  RTCRayQueryContext **ppRVar3;
  float *pfVar4;
  float *pfVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  int iVar7;
  RTCIntersectArguments *pRVar8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  int iVar13;
  undefined4 uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  RayHit *pRVar18;
  ulong uVar19;
  RayQueryContext *pRVar20;
  RayQueryContext *pRVar21;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  RayQueryContext *extraout_RDX_01;
  RayQueryContext *extraout_RDX_02;
  ulong uVar22;
  long lVar23;
  undefined1 auVar24 [4];
  ulong uVar25;
  Geometry *pGVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar88;
  float fVar89;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar90;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  float fVar103;
  float fVar104;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar122;
  float fVar123;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar124;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar136;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar139 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar169;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  vbool<4> valid;
  MapUV<embree::sse2::GridSOA::Gather2x3> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1258 [16];
  RayQueryContext *local_1248;
  undefined1 local_123c [8];
  float fStack_1234;
  undefined4 uStack_1230;
  undefined1 auStack_122c [8];
  float fStack_1224;
  undefined4 uStack_1220;
  float fStack_121c;
  undefined1 local_1218 [4];
  undefined1 auStack_1214 [8];
  float fStack_120c;
  undefined1 local_1208 [8];
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  uint auStack_11f0 [1];
  uint auStack_11ec [1];
  RayHit *local_11e0;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [16];
  float *local_11a0;
  ulong local_1198;
  ulong local_1190;
  RTCFilterFunctionNArguments local_1188;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined8 local_1138;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float local_1124;
  float local_1120;
  float local_111c;
  float local_1118;
  float local_1114;
  undefined4 local_1110;
  uint local_110c;
  uint local_1108;
  undefined1 local_10f8 [12];
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  float **local_10c8;
  undefined1 local_10b8 [16];
  float local_10a8 [4];
  float local_1098 [4];
  float local_1088 [4];
  undefined1 local_1078 [16];
  float local_1068 [4];
  float local_1058 [4];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar17;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar15 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar109 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar114 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar123 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar146 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar156 = (ray->super_RayK<1>).tfar;
    fVar131 = 0.0;
    if (0.0 <= fVar156) {
      fVar131 = fVar156;
    }
    uVar28 = -(uint)(1e-18 <= ABS(aVar6.x));
    uVar29 = -(uint)(1e-18 <= ABS(aVar6.y));
    uVar32 = -(uint)(1e-18 <= ABS(aVar6.z));
    uVar36 = -(uint)(1e-18 <= ABS(aVar6.field_3.w));
    auVar92 = divps(_DAT_01f7ba10,(undefined1  [16])aVar6);
    auVar67._0_4_ = auVar92._0_4_ & uVar28;
    auVar67._4_4_ = auVar92._4_4_ & uVar29;
    auVar67._8_4_ = auVar92._8_4_ & uVar32;
    auVar67._12_4_ = auVar92._12_4_ & uVar36;
    auVar92._0_8_ = CONCAT44(~uVar29,~uVar28) & 0x5d5e0b6b5d5e0b6b;
    auVar92._8_4_ = ~uVar32 & 0x5d5e0b6b;
    auVar92._12_4_ = ~uVar36 & 0x5d5e0b6b;
    fVar156 = 0.0;
    if (0.0 <= fVar146) {
      fVar156 = fVar146;
    }
    auVar92 = auVar92 | auVar67;
    fVar158 = auVar92._0_4_ * 0.99999964;
    fVar160 = auVar92._4_4_ * 0.99999964;
    fVar163 = auVar92._8_4_ * 0.99999964;
    fVar143 = auVar92._0_4_ * 1.0000004;
    fVar146 = auVar92._4_4_ * 1.0000004;
    fVar149 = auVar92._8_4_ * 1.0000004;
    bVar10 = fVar158 < 0.0;
    uVar22 = (ulong)(fVar160 < 0.0) << 4 | 0x20;
    uVar27 = (ulong)(fVar163 < 0.0) << 4 | 0x40;
    auVar139._4_4_ = fVar156;
    auVar139._0_4_ = fVar156;
    auVar139._8_4_ = fVar156;
    auVar139._12_4_ = fVar156;
    auVar40._4_4_ = fVar131;
    auVar40._0_4_ = fVar131;
    auVar40._8_4_ = fVar131;
    auVar40._12_4_ = fVar131;
    _local_ff8 = mm_lookupmask_ps._240_8_;
    _uStack_ff0 = mm_lookupmask_ps._248_8_;
    local_1248 = (RayQueryContext *)0x0;
    local_11e0 = ray;
    local_1008 = fVar158;
    fStack_1004 = fVar158;
    fStack_1000 = fVar158;
    fStack_ffc = fVar158;
    local_f88 = fVar123;
    fStack_f84 = fVar123;
    fStack_f80 = fVar123;
    fStack_f7c = fVar123;
    local_f98 = auVar139;
    local_fa8 = fVar149;
    fStack_fa4 = fVar149;
    fStack_fa0 = fVar149;
    fStack_f9c = fVar149;
    local_fb8 = fVar163;
    fStack_fb4 = fVar163;
    fStack_fb0 = fVar163;
    fStack_fac = fVar163;
    local_fc8 = fVar109;
    fStack_fc4 = fVar109;
    fStack_fc0 = fVar109;
    fStack_fbc = fVar109;
    local_fd8 = fVar114;
    fStack_fd4 = fVar114;
    fStack_fd0 = fVar114;
    fStack_fcc = fVar114;
    local_1018 = fVar160;
    fStack_1014 = fVar160;
    fStack_1010 = fVar160;
    fStack_100c = fVar160;
    local_fe8 = fVar143;
    fStack_fe4 = fVar143;
    fStack_fe0 = fVar143;
    fStack_fdc = fVar143;
    local_1048 = fVar146;
    fStack_1044 = fVar146;
    fStack_1040 = fVar146;
    fStack_103c = fVar146;
    pRVar21 = context;
    fVar156 = fVar146;
    fVar131 = fVar146;
    fVar103 = fVar146;
    fVar129 = fVar158;
    fVar157 = fVar158;
    fVar124 = fVar158;
    fVar130 = fVar160;
    fVar112 = fVar160;
    fVar77 = fVar160;
    fVar138 = fVar143;
    fVar137 = fVar143;
    fVar136 = fVar143;
    fVar128 = fVar149;
    fVar127 = fVar149;
    fVar126 = fVar149;
    fVar125 = fVar123;
    fVar122 = fVar123;
    fVar113 = fVar123;
    fVar111 = fVar163;
    fVar110 = fVar163;
    fVar106 = fVar163;
    fVar105 = fVar114;
    fVar104 = fVar114;
    fVar91 = fVar114;
    fVar90 = fVar109;
    fVar89 = fVar109;
    fVar88 = fVar109;
LAB_00d183fa:
    do {
      pauVar12 = pauVar15 + -1;
      pauVar15 = pauVar15 + -1;
      pfVar4 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar12 + 8) < *pfVar4 || *(float *)((long)*pauVar12 + 8) == *pfVar4) {
        pRVar20 = *(RayQueryContext **)*pauVar15;
        while (((ulong)pRVar20 & 8) == 0) {
          ppRVar3 = &pRVar20[1].user + (ulong)bVar10 * 2;
          auVar96._0_4_ = (*(float *)ppRVar3 - fVar88) * fVar158;
          auVar96._4_4_ = (*(float *)((long)ppRVar3 + 4) - fVar89) * fVar129;
          auVar96._8_4_ = (*(float *)(ppRVar3 + 1) - fVar90) * fVar157;
          auVar96._12_4_ = (*(float *)((long)ppRVar3 + 0xc) - fVar109) * fVar124;
          pfVar4 = (float *)((long)&pRVar20[1].user + uVar22);
          auVar116._0_4_ = (*pfVar4 - fVar91) * fVar160;
          auVar116._4_4_ = (pfVar4[1] - fVar104) * fVar130;
          auVar116._8_4_ = (pfVar4[2] - fVar105) * fVar112;
          auVar116._12_4_ = (pfVar4[3] - fVar114) * fVar77;
          auVar92 = maxps(auVar96,auVar116);
          pfVar4 = (float *)((long)&pRVar20[1].user + uVar27);
          auVar66._0_4_ = (*pfVar4 - fVar113) * fVar106;
          auVar66._4_4_ = (pfVar4[1] - fVar122) * fVar110;
          auVar66._8_4_ = (pfVar4[2] - fVar125) * fVar111;
          auVar66._12_4_ = (pfVar4[3] - fVar123) * fVar163;
          auVar67 = maxps(auVar66,auVar139);
          _local_10f8 = maxps(auVar92,auVar67);
          pfVar4 = (float *)((long)&pRVar20[1].user + ((ulong)bVar10 * 0x10 ^ 0x10));
          auVar68._0_4_ = (*pfVar4 - fVar88) * fVar136;
          auVar68._4_4_ = (pfVar4[1] - fVar89) * fVar137;
          auVar68._8_4_ = (pfVar4[2] - fVar90) * fVar138;
          auVar68._12_4_ = (pfVar4[3] - fVar109) * fVar143;
          pfVar4 = (float *)((long)&pRVar20[1].user + (uVar22 ^ 0x10));
          auVar78._0_4_ = (*pfVar4 - fVar91) * fVar146;
          auVar78._4_4_ = (pfVar4[1] - fVar104) * fVar156;
          auVar78._8_4_ = (pfVar4[2] - fVar105) * fVar131;
          auVar78._12_4_ = (pfVar4[3] - fVar114) * fVar103;
          auVar92 = minps(auVar68,auVar78);
          pfVar4 = (float *)((long)&pRVar20[1].user + (uVar27 ^ 0x10));
          auVar79._0_4_ = (*pfVar4 - fVar113) * fVar126;
          auVar79._4_4_ = (pfVar4[1] - fVar122) * fVar127;
          auVar79._8_4_ = (pfVar4[2] - fVar125) * fVar128;
          auVar79._12_4_ = (pfVar4[3] - fVar123) * fVar149;
          auVar67 = minps(auVar79,auVar40);
          auVar92 = minps(auVar92,auVar67);
          auVar108._4_4_ = -(uint)(local_10f8._4_4_ <= auVar92._4_4_);
          auVar108._0_4_ = -(uint)(local_10f8._0_4_ <= auVar92._0_4_);
          auVar108._8_4_ = -(uint)(local_10f8._8_4_ <= auVar92._8_4_);
          auVar108._12_4_ = -(uint)(local_10f8._12_4_ <= auVar92._12_4_);
          uVar28 = movmskps((int)pRVar21,auVar108);
          if (uVar28 == 0) {
            pRVar21 = (RayQueryContext *)(ulong)uVar28;
            if (pauVar15 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d183fa;
          }
          uVar19 = (ulong)pRVar20 & 0xfffffffffffffff0;
          lVar11 = 0;
          if ((byte)uVar28 != 0) {
            for (; ((byte)uVar28 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          pRVar20 = *(RayQueryContext **)(uVar19 + lVar11 * 8);
          uVar28 = (uVar28 & 0xff) - 1 & uVar28 & 0xff;
          pRVar21 = pRVar20;
          if (uVar28 != 0) {
            uVar29 = *(uint *)(local_10f8 + lVar11 * 4);
            lVar11 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            pRVar21 = *(RayQueryContext **)(uVar19 + lVar11 * 8);
            uVar32 = *(uint *)(local_10f8 + lVar11 * 4);
            uVar28 = uVar28 - 1 & uVar28;
            if (uVar28 == 0) {
              if (uVar29 < uVar32) {
                *(RayQueryContext **)*pauVar15 = pRVar21;
                *(uint *)((long)*pauVar15 + 8) = uVar32;
                pauVar15 = pauVar15 + 1;
                pRVar21 = pRVar20;
              }
              else {
                *(RayQueryContext **)*pauVar15 = pRVar20;
                *(uint *)((long)*pauVar15 + 8) = uVar29;
                pauVar15 = pauVar15 + 1;
                pRVar20 = pRVar21;
              }
            }
            else {
              auVar49._8_4_ = uVar29;
              auVar49._0_8_ = pRVar20;
              auVar49._12_4_ = 0;
              auVar69._8_4_ = uVar32;
              auVar69._0_8_ = pRVar21;
              auVar69._12_4_ = 0;
              lVar11 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                }
              }
              uVar16 = *(ulong *)(uVar19 + lVar11 * 8);
              iVar13 = *(int *)(local_10f8 + lVar11 * 4);
              auVar80._8_4_ = iVar13;
              auVar80._0_8_ = uVar16;
              auVar80._12_4_ = 0;
              auVar93._8_4_ = -(uint)((int)uVar29 < (int)uVar32);
              uVar28 = uVar28 - 1 & uVar28;
              fVar156 = fStack_1044;
              fVar131 = fStack_1040;
              fVar103 = fStack_103c;
              fVar146 = local_1048;
              if (uVar28 == 0) {
                auVar93._4_4_ = auVar93._8_4_;
                auVar93._0_4_ = auVar93._8_4_;
                auVar93._12_4_ = auVar93._8_4_;
                auVar92 = auVar49 & auVar93 | ~auVar93 & auVar69;
                auVar67 = auVar69 & auVar93 | ~auVar93 & auVar49;
                auVar94._8_4_ = -(uint)(auVar92._8_4_ < iVar13);
                auVar94._0_8_ = CONCAT44(auVar94._8_4_,auVar94._8_4_);
                auVar94._12_4_ = auVar94._8_4_;
                pRVar20 = (RayQueryContext *)
                          (~auVar94._0_8_ & uVar16 | auVar92._0_8_ & auVar94._0_8_);
                auVar92 = auVar80 & auVar94 | ~auVar94 & auVar92;
                auVar50._8_4_ = -(uint)(auVar67._8_4_ < auVar92._8_4_);
                auVar50._4_4_ = auVar50._8_4_;
                auVar50._0_4_ = auVar50._8_4_;
                auVar50._12_4_ = auVar50._8_4_;
                *pauVar15 = ~auVar50 & auVar67 | auVar92 & auVar50;
                pauVar15[1] = auVar67 & auVar50 | ~auVar50 & auVar92;
                pauVar15 = pauVar15 + 2;
                pRVar21 = pRVar20;
              }
              else {
                lVar11 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                iVar7 = *(int *)(local_10f8 + lVar11 * 4);
                auVar107._8_4_ = iVar7;
                auVar107._0_8_ = *(undefined8 *)(uVar19 + lVar11 * 8);
                auVar107._12_4_ = 0;
                auVar95._4_4_ = auVar93._8_4_;
                auVar95._0_4_ = auVar93._8_4_;
                auVar95._8_4_ = auVar93._8_4_;
                auVar95._12_4_ = auVar93._8_4_;
                auVar92 = auVar49 & auVar95 | ~auVar95 & auVar69;
                auVar67 = auVar69 & auVar95 | ~auVar95 & auVar49;
                auVar115._0_4_ = -(uint)(iVar13 < iVar7);
                auVar115._4_4_ = -(uint)(iVar13 < iVar7);
                auVar115._8_4_ = -(uint)(iVar13 < iVar7);
                auVar115._12_4_ = -(uint)(iVar13 < iVar7);
                auVar96 = auVar80 & auVar115 | ~auVar115 & auVar107;
                auVar116 = ~auVar115 & auVar80 | auVar107 & auVar115;
                auVar81._8_4_ = -(uint)(auVar67._8_4_ < auVar116._8_4_);
                auVar81._4_4_ = auVar81._8_4_;
                auVar81._0_4_ = auVar81._8_4_;
                auVar81._12_4_ = auVar81._8_4_;
                auVar108 = auVar67 & auVar81 | ~auVar81 & auVar116;
                auVar70._8_4_ = -(uint)(auVar92._8_4_ < auVar96._8_4_);
                auVar70._0_8_ = CONCAT44(auVar70._8_4_,auVar70._8_4_);
                auVar70._12_4_ = auVar70._8_4_;
                pRVar20 = (RayQueryContext *)
                          (auVar92._0_8_ & auVar70._0_8_ | ~auVar70._0_8_ & auVar96._0_8_);
                auVar92 = ~auVar70 & auVar92 | auVar96 & auVar70;
                auVar51._8_4_ = -(uint)(auVar92._8_4_ < auVar108._8_4_);
                auVar51._4_4_ = auVar51._8_4_;
                auVar51._0_4_ = auVar51._8_4_;
                auVar51._12_4_ = auVar51._8_4_;
                *pauVar15 = ~auVar81 & auVar67 | auVar116 & auVar81;
                pauVar15[1] = ~auVar51 & auVar92 | auVar108 & auVar51;
                pauVar15[2] = auVar92 & auVar51 | ~auVar51 & auVar108;
                pauVar15 = pauVar15 + 3;
                pRVar21 = pRVar20;
                fVar158 = local_1008;
                fVar129 = fStack_1004;
                fVar157 = fStack_1000;
                fVar124 = fStack_ffc;
                fVar160 = local_1018;
                fVar130 = fStack_1014;
                fVar112 = fStack_1010;
                fVar77 = fStack_100c;
              }
            }
          }
        }
        if (((uint)pRVar20 & 0xf) == 8) {
          uVar19 = CONCAT44(0,*(uint *)((long)&local_1248->user + 4));
          lVar23 = (long)&local_1248->scene +
                   ((ulong)pRVar20 >> 4) * 4 + (ulong)*(uint *)((long)&local_1248[1].user + 4);
          uVar16 = (ulong)*(uint *)((long)&local_1248->args + 4);
          lVar11 = lVar23 + uVar16 * 4;
          pRVar21 = (RayQueryContext *)(lVar11 + 0x2c);
          pfVar4 = (float *)(lVar23 + 0x2c + uVar16 * 8);
          local_1208._4_4_ = *(float *)(lVar23 + 0x30);
          pfVar5 = (float *)(lVar23 + 0x2c + uVar19 * 4);
          fVar156 = pfVar5[1];
          if (uVar19 == 2) {
            fVar131 = *(float *)&pRVar21->scene;
            fVar109 = *(float *)(lVar11 + 0x30);
            fVar114 = *(float *)(lVar11 + 0x34);
            fVar123 = *(float *)(lVar11 + 0x38);
            fVar146 = *pfVar4;
            fVar103 = pfVar4[1];
            fVar158 = pfVar4[2];
            fVar129 = pfVar4[3];
            fVar157 = fVar156;
            fVar124 = fVar123;
            fVar160 = fVar103;
            fVar130 = fVar129;
            fStack_11fc = (float)local_1208._4_4_;
            fVar112 = fVar109;
          }
          else {
            fVar131 = *(float *)&pRVar21->scene;
            fVar109 = *(float *)(lVar11 + 0x30);
            pfVar1 = (float *)((long)&pRVar21->scene + uVar19 * 4);
            fVar114 = *pfVar1;
            fVar123 = pfVar1[1];
            fVar146 = *pfVar4;
            fVar103 = pfVar4[1];
            pfVar2 = pfVar4 + uVar19;
            fVar158 = *pfVar2;
            fVar129 = pfVar2[1];
            fVar157 = pfVar5[2];
            fVar124 = pfVar1[2];
            fVar160 = pfVar4[2];
            fVar130 = pfVar2[2];
            fStack_11fc = *(float *)(lVar23 + 0x34);
            fVar112 = *(float *)(lVar11 + 0x34);
          }
          fVar77 = (ray->super_RayK<1>).org.field_0.m128[0];
          fVar88 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar89 = (ray->super_RayK<1>).org.field_0.m128[2];
          local_1028 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fStack_1234 = (ray->super_RayK<1>).dir.field_0.m128[1];
          fStack_1224 = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_1148 = *(float *)(lVar23 + 0x2c) - fVar77;
          fStack_1144 = *pfVar5 - fVar77;
          fStack_1140 = (float)local_1208._4_4_ - fVar77;
          fStack_113c = fVar156 - fVar77;
          fVar131 = fVar131 - fVar88;
          fVar136 = fVar114 - fVar88;
          fStack_11c0 = fVar109 - fVar88;
          fStack_11bc = fVar123 - fVar88;
          fVar146 = fVar146 - fVar89;
          fVar161 = fVar158 - fVar89;
          fStack_11d0 = fVar103 - fVar89;
          fStack_11cc = fVar129 - fVar89;
          local_1208._0_4_ = (float)local_1208._4_4_ - fVar77;
          local_1208._4_4_ = (float)local_1208._4_4_ - fVar77;
          fStack_1200 = fStack_11fc - fVar77;
          fStack_11fc = fStack_11fc - fVar77;
          fVar105 = fVar109 - fVar88;
          fVar109 = fVar109 - fVar88;
          fVar111 = fVar112 - fVar88;
          fVar112 = fVar112 - fVar88;
          fVar91 = fVar103 - fVar89;
          fVar103 = fVar103 - fVar89;
          fVar104 = fVar160 - fVar89;
          fVar160 = fVar160 - fVar89;
          fVar154 = *pfVar5 - fVar77;
          fVar155 = fVar156 - fVar77;
          fVar156 = fVar156 - fVar77;
          fVar157 = fVar157 - fVar77;
          fVar114 = fVar114 - fVar88;
          fVar122 = fVar123 - fVar88;
          fVar123 = fVar123 - fVar88;
          fVar124 = fVar124 - fVar88;
          fVar158 = fVar158 - fVar89;
          fVar149 = fVar129 - fVar89;
          fVar129 = fVar129 - fVar89;
          fVar130 = fVar130 - fVar89;
          fVar144 = fVar154 - local_1148;
          fVar147 = fVar155 - fStack_1144;
          fVar150 = fVar156 - fStack_1140;
          fVar152 = fVar157 - fStack_113c;
          fVar137 = fVar114 - fVar131;
          fVar143 = fVar122 - fVar136;
          fStack_1130 = fVar123 - fStack_11c0;
          fStack_112c = fVar124 - fStack_11bc;
          local_11f8._0_4_ = fVar158 - fVar146;
          local_11f8._4_4_ = fVar149 - fVar161;
          auStack_11f0[0] = (uint)(fVar129 - fStack_11d0);
          auStack_11ec[0] = (uint)(fVar130 - fStack_11cc);
          local_1138 = CONCAT44(fVar143,fVar137);
          auStack_1214._0_4_ = fVar147;
          local_1218 = (undefined1  [4])fVar144;
          auStack_1214._4_4_ = fVar150;
          fStack_120c = fVar152;
          auStack_122c._4_4_ = fStack_1224;
          uStack_1220 = fStack_1224;
          fStack_121c = fStack_1224;
          fVar77 = fVar131 - fVar105;
          fVar88 = fVar136 - fVar109;
          fVar89 = fStack_11c0 - fVar111;
          fVar90 = fStack_11bc - fVar112;
          fVar166 = (fVar137 * (fVar158 + fVar146) - (float)local_11f8 * (fVar114 + fVar131)) *
                    local_1028 +
                    ((float)local_11f8 * (fVar154 + local_1148) - (fVar158 + fVar146) * fVar144) *
                    fStack_1234 +
                    ((fVar114 + fVar131) * fVar144 - (fVar154 + local_1148) * fVar137) * fStack_1224
          ;
          fVar169 = (fVar143 * (fVar149 + fVar161) - local_11f8._4_4_ * (fVar122 + fVar136)) *
                    local_1028 +
                    (local_11f8._4_4_ * (fVar155 + fStack_1144) - (fVar149 + fVar161) * fVar147) *
                    fStack_1234 +
                    ((fVar122 + fVar136) * fVar147 - (fVar155 + fStack_1144) * fVar143) *
                    fStack_1224;
          _local_1218 = CONCAT44(fVar169,fVar166);
          auStack_1214._4_4_ =
               (fStack_1130 * (fVar129 + fStack_11d0) -
               (float)auStack_11f0[0] * (fVar123 + fStack_11c0)) * local_1028 +
               ((float)auStack_11f0[0] * (fVar156 + fStack_1140) - (fVar129 + fStack_11d0) * fVar150
               ) * fStack_1234 +
               ((fVar123 + fStack_11c0) * fVar150 - (fVar156 + fStack_1140) * fStack_1130) *
               fStack_1224;
          fStack_120c = (fStack_112c * (fVar130 + fStack_11cc) -
                        (float)auStack_11ec[0] * (fVar124 + fStack_11bc)) * local_1028 +
                        ((float)auStack_11ec[0] * (fVar157 + fStack_113c) -
                        (fVar130 + fStack_11cc) * fVar152) * fStack_1234 +
                        ((fVar124 + fStack_11bc) * fVar152 - (fVar157 + fStack_113c) * fStack_112c)
                        * fStack_1224;
          fVar145 = fVar146 - fVar91;
          fVar148 = fVar161 - fVar103;
          fVar151 = fStack_11d0 - fVar104;
          fVar153 = fStack_11cc - fVar160;
          local_11c8 = (RTCRayQueryContext *)CONCAT44(fVar136,fVar131);
          local_11d8 = CONCAT44(fVar161,fVar146);
          fVar106 = local_1148 - (float)local_1208._0_4_;
          fVar110 = fStack_1144 - (float)local_1208._4_4_;
          fVar163 = fStack_1140 - fStack_1200;
          fVar113 = fStack_113c - fStack_11fc;
          auVar132._0_4_ =
               (fVar77 * (fVar146 + fVar91) - fVar145 * (fVar131 + fVar105)) * local_1028 +
               (fVar145 * (local_1148 + (float)local_1208._0_4_) - (fVar146 + fVar91) * fVar106) *
               fStack_1234 +
               ((fVar131 + fVar105) * fVar106 - (local_1148 + (float)local_1208._0_4_) * fVar77) *
               fStack_1224;
          auVar132._4_4_ =
               (fVar88 * (fVar161 + fVar103) - fVar148 * (fVar136 + fVar109)) * local_1028 +
               (fVar148 * (fStack_1144 + (float)local_1208._4_4_) - (fVar161 + fVar103) * fVar110) *
               fStack_1234 +
               ((fVar136 + fVar109) * fVar110 - (fStack_1144 + (float)local_1208._4_4_) * fVar88) *
               fStack_1224;
          auVar132._8_4_ =
               (fVar89 * (fStack_11d0 + fVar104) - fVar151 * (fStack_11c0 + fVar111)) * local_1028 +
               (fVar151 * (fStack_1140 + fStack_1200) - (fStack_11d0 + fVar104) * fVar163) *
               fStack_1234 +
               ((fStack_11c0 + fVar111) * fVar163 - (fStack_1140 + fStack_1200) * fVar89) *
               fStack_1224;
          auVar132._12_4_ =
               (fVar90 * (fStack_11cc + fVar160) - fVar153 * (fStack_11bc + fVar112)) * local_1028 +
               (fVar153 * (fStack_113c + fStack_11fc) - (fStack_11cc + fVar160) * fVar113) *
               fStack_1234 +
               ((fStack_11bc + fVar112) * fVar113 - (fStack_113c + fStack_11fc) * fVar90) *
               fStack_1224;
          fVar138 = (float)local_1208._0_4_ - fVar154;
          fVar140 = (float)local_1208._4_4_ - fVar155;
          fVar141 = fStack_1200 - fVar156;
          fVar142 = fStack_11fc - fVar157;
          fVar159 = fVar105 - fVar114;
          fVar162 = fVar109 - fVar122;
          fVar164 = fVar111 - fVar123;
          fVar165 = fVar112 - fVar124;
          fVar125 = fVar91 - fVar158;
          fVar126 = fVar103 - fVar149;
          fVar127 = fVar104 - fVar129;
          fVar128 = fVar160 - fVar130;
          local_123c._4_4_ = fStack_1234;
          uStack_1230 = fStack_1234;
          auStack_122c._0_4_ = fStack_1234;
          auVar71._0_4_ =
               (fVar159 * (fVar158 + fVar91) - fVar125 * (fVar114 + fVar105)) * local_1028 +
               (fVar125 * (fVar154 + (float)local_1208._0_4_) - (fVar158 + fVar91) * fVar138) *
               fStack_1234 +
               ((fVar114 + fVar105) * fVar138 - (fVar154 + (float)local_1208._0_4_) * fVar159) *
               fStack_1224;
          auVar71._4_4_ =
               (fVar162 * (fVar149 + fVar103) - fVar126 * (fVar122 + fVar109)) * local_1028 +
               (fVar126 * (fVar155 + (float)local_1208._4_4_) - (fVar149 + fVar103) * fVar140) *
               fStack_1234 +
               ((fVar122 + fVar109) * fVar140 - (fVar155 + (float)local_1208._4_4_) * fVar162) *
               fStack_1224;
          auVar71._8_4_ =
               (fVar164 * (fVar129 + fVar104) - fVar127 * (fVar123 + fVar111)) * local_1028 +
               (fVar127 * (fVar156 + fStack_1200) - (fVar129 + fVar104) * fVar141) * fStack_1234 +
               ((fVar123 + fVar111) * fVar141 - (fVar156 + fStack_1200) * fVar164) * fStack_1224;
          auVar71._12_4_ =
               (fVar165 * (fVar130 + fVar160) - fVar128 * (fVar124 + fVar112)) * local_1028 +
               (fVar128 * (fVar157 + fStack_11fc) - (fVar130 + fVar160) * fVar142) * fStack_1234 +
               ((fVar124 + fVar112) * fVar142 - (fVar157 + fStack_11fc) * fVar165) * fStack_1224;
          local_1158 = fVar166 + auVar132._0_4_ + auVar71._0_4_;
          fStack_1154 = fVar169 + auVar132._4_4_ + auVar71._4_4_;
          fStack_1150 = (float)auStack_1214._4_4_ + auVar132._8_4_ + auVar71._8_4_;
          fStack_114c = fStack_120c + auVar132._12_4_ + auVar71._12_4_;
          auVar117._8_4_ = auStack_1214._4_4_;
          auVar117._0_8_ = _local_1218;
          auVar117._12_4_ = fStack_120c;
          auVar92 = minps(auVar117,auVar132);
          auVar67 = minps(auVar92,auVar71);
          auVar97._8_4_ = auStack_1214._4_4_;
          auVar97._0_8_ = _local_1218;
          auVar97._12_4_ = fStack_120c;
          auVar92 = maxps(auVar97,auVar132);
          auVar92 = maxps(auVar92,auVar71);
          local_1038 = ABS(local_1158);
          fStack_1034 = ABS(fStack_1154);
          fStack_1030 = ABS(fStack_1150);
          fStack_102c = ABS(fStack_114c);
          auVar98._4_4_ = -(uint)(auVar92._4_4_ <= fStack_1034 * 1.1920929e-07);
          auVar98._0_4_ = -(uint)(auVar92._0_4_ <= local_1038 * 1.1920929e-07);
          auVar98._8_4_ = -(uint)(auVar92._8_4_ <= fStack_1030 * 1.1920929e-07);
          auVar98._12_4_ = -(uint)(auVar92._12_4_ <= fStack_102c * 1.1920929e-07);
          auVar118._4_4_ = -(uint)(-(fStack_1034 * 1.1920929e-07) <= auVar67._4_4_);
          auVar118._0_4_ = -(uint)(-(local_1038 * 1.1920929e-07) <= auVar67._0_4_);
          auVar118._8_4_ = -(uint)(-(fStack_1030 * 1.1920929e-07) <= auVar67._8_4_);
          auVar118._12_4_ = -(uint)(-(fStack_102c * 1.1920929e-07) <= auVar67._12_4_);
          auVar98 = auVar98 | auVar118;
          uVar25 = (ulong)*(uint *)&local_1248->args;
          local_11a0 = (float *)(lVar23 + 0x2c + uVar16 * 0xc);
          local_1198 = uVar19;
          local_1190 = uVar25;
          auVar99._0_4_ = auVar98._0_4_ & local_ff8;
          auVar99._4_4_ = auVar98._4_4_ & uStack_ff4;
          auVar99._8_4_ = auVar98._8_4_ & uStack_ff0;
          auVar99._12_4_ = auVar98._12_4_ & uStack_fec;
          iVar13 = movmskps((int)local_11a0,auVar99);
          if (iVar13 != 0) {
            _local_1208 = auVar132;
            fStack_1024 = local_1028;
            fStack_1020 = local_1028;
            fStack_101c = local_1028;
            uVar28 = -(uint)(ABS(fVar145 * fVar159) <= ABS((float)local_11f8 * fVar77));
            uVar36 = -(uint)(ABS(fVar148 * fVar162) <= ABS(local_11f8._4_4_ * fVar88));
            uVar33 = -(uint)(ABS(fVar151 * fVar164) <= ABS((float)auStack_11f0[0] * fVar89));
            uVar37 = -(uint)(ABS(fVar153 * fVar165) <= ABS((float)auStack_11ec[0] * fVar90));
            uVar29 = -(uint)(ABS(fVar106 * fVar125) <= ABS(fVar144 * fVar145));
            uVar30 = -(uint)(ABS(fVar110 * fVar126) <= ABS(fVar147 * fVar148));
            uVar34 = -(uint)(ABS(fVar163 * fVar127) <= ABS(fVar150 * fVar151));
            uVar38 = -(uint)(ABS(fVar113 * fVar128) <= ABS(fVar152 * fVar153));
            uVar32 = -(uint)(ABS(fVar77 * fVar138) <= ABS(fVar137 * fVar106));
            uVar31 = -(uint)(ABS(fVar88 * fVar140) <= ABS(fVar143 * fVar110));
            uVar35 = -(uint)(ABS(fVar89 * fVar141) <= ABS(fStack_1130 * fVar163));
            uVar39 = -(uint)(ABS(fVar90 * fVar142) <= ABS(fStack_112c * fVar113));
            auVar82._0_4_ = (uint)(fVar77 * fVar125 - fVar145 * fVar159) & uVar28;
            auVar82._4_4_ = (uint)(fVar88 * fVar126 - fVar148 * fVar162) & uVar36;
            auVar82._8_4_ = (uint)(fVar89 * fVar127 - fVar151 * fVar164) & uVar33;
            auVar82._12_4_ = (uint)(fVar90 * fVar128 - fVar153 * fVar165) & uVar37;
            local_1078._0_4_ = ~uVar28 & (uint)(fVar137 * fVar145 - (float)local_11f8 * fVar77);
            local_1078._4_4_ = ~uVar36 & (uint)(fVar143 * fVar148 - local_11f8._4_4_ * fVar88);
            local_1078._8_4_ =
                 ~uVar33 & (uint)(fStack_1130 * fVar151 - (float)auStack_11f0[0] * fVar89);
            local_1078._12_4_ =
                 ~uVar37 & (uint)(fStack_112c * fVar153 - (float)auStack_11ec[0] * fVar90);
            local_1078 = local_1078 | auVar82;
            local_1068[0] =
                 (float)(~uVar29 & (uint)((float)local_11f8 * fVar106 - fVar144 * fVar145) |
                        (uint)(fVar145 * fVar138 - fVar106 * fVar125) & uVar29);
            local_1068[1] =
                 (float)(~uVar30 & (uint)(local_11f8._4_4_ * fVar110 - fVar147 * fVar148) |
                        (uint)(fVar148 * fVar140 - fVar110 * fVar126) & uVar30);
            local_1068[2] =
                 (float)(~uVar34 & (uint)((float)auStack_11f0[0] * fVar163 - fVar150 * fVar151) |
                        (uint)(fVar151 * fVar141 - fVar163 * fVar127) & uVar34);
            local_1068[3] =
                 (float)(~uVar38 & (uint)((float)auStack_11ec[0] * fVar113 - fVar152 * fVar153) |
                        (uint)(fVar153 * fVar142 - fVar113 * fVar128) & uVar38);
            local_10d8._4_4_ = fStack_1154;
            local_10d8._0_4_ = local_1158;
            local_10d8._8_4_ = fStack_1150;
            local_10d8._12_4_ = fStack_114c;
            local_1058[0] =
                 (float)(~uVar32 & (uint)(fVar144 * fVar77 - fVar137 * fVar106) |
                        (uint)(fVar106 * fVar159 - fVar77 * fVar138) & uVar32);
            local_1058[1] =
                 (float)(~uVar31 & (uint)(fVar147 * fVar88 - fVar143 * fVar110) |
                        (uint)(fVar110 * fVar162 - fVar88 * fVar140) & uVar31);
            local_1058[2] =
                 (float)(~uVar35 & (uint)(fVar150 * fVar89 - fStack_1130 * fVar163) |
                        (uint)(fVar163 * fVar164 - fVar89 * fVar141) & uVar35);
            local_1058[3] =
                 (float)(~uVar39 & (uint)(fVar152 * fVar90 - fStack_112c * fVar113) |
                        (uint)(fVar113 * fVar165 - fVar90 * fVar142) & uVar39);
            fVar156 = local_1028 * local_1078._0_4_ +
                      fStack_1234 * local_1068[0] + fStack_1224 * local_1058[0];
            fVar109 = local_1028 * local_1078._4_4_ +
                      fStack_1234 * local_1068[1] + fStack_1224 * local_1058[1];
            fVar114 = local_1028 * local_1078._8_4_ +
                      fStack_1234 * local_1068[2] + fStack_1224 * local_1058[2];
            fVar123 = local_1028 * local_1078._12_4_ +
                      fStack_1234 * local_1068[3] + fStack_1224 * local_1058[3];
            auVar41._0_4_ = fVar156 + fVar156;
            auVar41._4_4_ = fVar109 + fVar109;
            auVar41._8_4_ = fVar114 + fVar114;
            auVar41._12_4_ = fVar123 + fVar123;
            auVar52._0_4_ = fVar131 * local_1068[0] + fVar146 * local_1058[0];
            auVar52._4_4_ = fVar136 * local_1068[1] + fVar161 * local_1058[1];
            auVar52._8_4_ = fStack_11c0 * local_1068[2] + fStack_11d0 * local_1058[2];
            auVar52._12_4_ = fStack_11bc * local_1068[3] + fStack_11cc * local_1058[3];
            fVar109 = local_1148 * local_1078._0_4_ + auVar52._0_4_;
            fVar114 = fStack_1144 * local_1078._4_4_ + auVar52._4_4_;
            fVar103 = fStack_1140 * local_1078._8_4_ + auVar52._8_4_;
            fVar158 = fStack_113c * local_1078._12_4_ + auVar52._12_4_;
            auVar92 = rcpps(auVar52,auVar41);
            fVar156 = auVar92._0_4_;
            fVar131 = auVar92._4_4_;
            fVar123 = auVar92._8_4_;
            fVar146 = auVar92._12_4_;
            fVar109 = ((1.0 - auVar41._0_4_ * fVar156) * fVar156 + fVar156) * (fVar109 + fVar109);
            fVar114 = ((1.0 - auVar41._4_4_ * fVar131) * fVar131 + fVar131) * (fVar114 + fVar114);
            fVar123 = ((1.0 - auVar41._8_4_ * fVar123) * fVar123 + fVar123) * (fVar103 + fVar103);
            fVar146 = ((1.0 - auVar41._12_4_ * fVar146) * fVar146 + fVar146) * (fVar158 + fVar158);
            fVar156 = (ray->super_RayK<1>).tfar;
            fVar131 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar42._0_4_ =
                 (int)((uint)(auVar41._0_4_ != 0.0 && (fVar109 <= fVar156 && fVar131 <= fVar109)) *
                      -0x80000000) >> 0x1f;
            auVar42._4_4_ =
                 (int)((uint)(auVar41._4_4_ != 0.0 && (fVar114 <= fVar156 && fVar131 <= fVar114)) *
                      -0x80000000) >> 0x1f;
            auVar42._8_4_ =
                 (int)((uint)(auVar41._8_4_ != 0.0 && (fVar123 <= fVar156 && fVar131 <= fVar123)) *
                      -0x80000000) >> 0x1f;
            auVar42._12_4_ =
                 (int)((uint)(auVar41._12_4_ != 0.0 && (fVar146 <= fVar156 && fVar131 <= fVar146)) *
                      -0x80000000) >> 0x1f;
            auVar43 = auVar42 & auVar99;
            iVar13 = movmskps(iVar13,auVar43);
            if (iVar13 != 0) {
              fVar156 = *(float *)&local_1248[1].scene;
              uVar16 = (ulong)(uint)fVar156;
              fVar131 = *(float *)((long)&local_1248[1].scene + 4);
              pRVar21 = (RayQueryContext *)(ulong)(uint)fVar131;
              local_10f8._8_4_ = auStack_1214._4_4_;
              local_10f8._0_8_ = _local_1218;
              fStack_10ec = fStack_120c;
              local_10e8 = auVar132._0_4_;
              fStack_10e4 = auVar132._4_4_;
              fStack_10e0 = auVar132._8_4_;
              fStack_10dc = auVar132._12_4_;
              local_10c8 = &local_11a0;
              local_10b8 = auVar43;
              local_1088[0] = fVar109;
              local_1088[1] = fVar114;
              local_1088[2] = fVar123;
              local_1088[3] = fVar146;
              unique0x00012000 = (context->scene->geometries).items[uVar16].ptr;
              if ((((Geometry *)unique0x00012000)->mask & (ray->super_RayK<1>).mask) != 0) {
                local_11b8 = auVar43;
                fVar103 = local_11a0[1];
                pfVar4 = local_11a0 + uVar19;
                fVar158 = *pfVar4;
                fVar129 = pfVar4[1];
                fVar157 = local_11a0[2];
                fVar124 = pfVar4[2];
                if (uVar19 == 2) {
                  fVar157 = fVar103;
                  fVar124 = fVar129;
                }
                auVar92 = rcpps(auVar82,local_10d8);
                fVar160 = auVar92._0_4_;
                fVar130 = auVar92._4_4_;
                fVar112 = auVar92._8_4_;
                fVar77 = auVar92._12_4_;
                fVar160 = (float)(-(uint)(1e-18 <= local_1038) &
                                 (uint)(((float)DAT_01f7ba10 - local_1158 * fVar160) * fVar160 +
                                       fVar160));
                fVar130 = (float)(-(uint)(1e-18 <= fStack_1034) &
                                 (uint)((DAT_01f7ba10._4_4_ - fStack_1154 * fVar130) * fVar130 +
                                       fVar130));
                fVar112 = (float)(-(uint)(1e-18 <= fStack_1030) &
                                 (uint)((DAT_01f7ba10._8_4_ - fStack_1150 * fVar112) * fVar112 +
                                       fVar112));
                fVar77 = (float)(-(uint)(1e-18 <= fStack_102c) &
                                (uint)((DAT_01f7ba10._12_4_ - fStack_114c * fVar77) * fVar77 +
                                      fVar77));
                auVar167._0_4_ = fVar166 * fVar160;
                auVar167._4_4_ = fVar169 * fVar130;
                auVar167._8_4_ = (float)auStack_1214._4_4_ * fVar112;
                auVar167._12_4_ = fStack_120c * fVar77;
                auVar67 = minps(auVar167,_DAT_01f7ba10);
                auVar133._0_4_ = auVar132._0_4_ * fVar160;
                auVar133._4_4_ = auVar132._4_4_ * fVar130;
                auVar133._8_4_ = auVar132._8_4_ * fVar112;
                auVar133._12_4_ = auVar132._12_4_ * fVar77;
                auVar92 = minps(auVar133,_DAT_01f7ba10);
                fVar104 = auVar67._0_4_;
                fVar105 = auVar67._4_4_;
                fVar106 = auVar67._8_4_;
                fVar110 = auVar67._12_4_;
                fVar88 = auVar92._0_4_;
                fVar89 = auVar92._4_4_;
                fVar90 = auVar92._8_4_;
                fVar91 = auVar92._12_4_;
                fVar160 = ((float)DAT_01f7ba10 - fVar104) - fVar88;
                fVar130 = (DAT_01f7ba10._4_4_ - fVar105) - fVar89;
                fVar112 = (DAT_01f7ba10._8_4_ - fVar106) - fVar90;
                fVar77 = (DAT_01f7ba10._12_4_ - fVar110) - fVar91;
                local_10a8[0] =
                     (float)((uint)*local_11a0 & 0xffff) * 0.00012207031 * fVar160 +
                     (float)((uint)fVar158 & 0xffff) * 0.00012207031 * fVar88 +
                     (float)((uint)fVar103 & 0xffff) * 0.00012207031 * fVar104;
                local_10a8[1] =
                     (float)((uint)fVar158 & 0xffff) * 0.00012207031 * fVar130 +
                     (float)((uint)fVar129 & 0xffff) * 0.00012207031 * fVar89 +
                     (float)((uint)fVar103 & 0xffff) * 0.00012207031 * fVar105;
                local_10a8[2] =
                     (float)((uint)fVar103 & 0xffff) * 0.00012207031 * fVar112 +
                     (float)((uint)fVar129 & 0xffff) * 0.00012207031 * fVar90 +
                     (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar106;
                local_10a8[3] =
                     (float)((uint)fVar129 & 0xffff) * 0.00012207031 * fVar77 +
                     (float)((uint)fVar124 & 0xffff) * 0.00012207031 * fVar91 +
                     (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar110;
                local_1098[0] =
                     fVar160 * (float)((uint)*local_11a0 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar158 >> 0x10) * 0.00012207031 * fVar88 +
                     (float)((uint)fVar103 >> 0x10) * 0.00012207031 * fVar104;
                local_1098[1] =
                     fVar130 * (float)((uint)fVar158 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar129 >> 0x10) * 0.00012207031 * fVar89 +
                     (float)((uint)fVar103 >> 0x10) * 0.00012207031 * fVar105;
                local_1098[2] =
                     fVar112 * (float)((uint)fVar103 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar129 >> 0x10) * 0.00012207031 * fVar90 +
                     (float)((uint)fVar157 >> 0x10) * 0.00012207031 * fVar106;
                local_1098[3] =
                     fVar77 * (float)((uint)fVar129 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar124 >> 0x10) * 0.00012207031 * fVar91 +
                     (float)((uint)fVar157 >> 0x10) * 0.00012207031 * fVar110;
                uVar28 = auVar43._0_4_;
                uVar29 = auVar43._4_4_;
                uVar32 = auVar43._8_4_;
                uVar36 = auVar43._12_4_;
                auVar53._0_4_ = uVar28 & (uint)fVar109;
                auVar53._4_4_ = uVar29 & (uint)fVar114;
                auVar53._8_4_ = uVar32 & (uint)fVar123;
                auVar53._12_4_ = uVar36 & (uint)fVar146;
                auVar72._0_8_ = CONCAT44(~uVar29,~uVar28) & 0x7f8000007f800000;
                auVar72._8_4_ = ~uVar32 & 0x7f800000;
                auVar72._12_4_ = ~uVar36 & 0x7f800000;
                auVar72 = auVar72 | auVar53;
                auVar83._4_4_ = auVar72._0_4_;
                auVar83._0_4_ = auVar72._4_4_;
                auVar83._8_4_ = auVar72._12_4_;
                auVar83._12_4_ = auVar72._8_4_;
                auVar92 = minps(auVar83,auVar72);
                auVar54._0_8_ = auVar92._8_8_;
                auVar54._8_4_ = auVar92._0_4_;
                auVar54._12_4_ = auVar92._4_4_;
                auVar92 = minps(auVar54,auVar92);
                auVar55._0_8_ =
                     CONCAT44(-(uint)(auVar92._4_4_ == auVar72._4_4_) & uVar29,
                              -(uint)(auVar92._0_4_ == auVar72._0_4_) & uVar28);
                auVar55._8_4_ = -(uint)(auVar92._8_4_ == auVar72._8_4_) & uVar32;
                auVar55._12_4_ = -(uint)(auVar92._12_4_ == auVar72._12_4_) & uVar36;
                iVar13 = movmskps((int)local_11a0,auVar55);
                if (iVar13 != 0) {
                  auVar43._8_4_ = auVar55._8_4_;
                  auVar43._0_8_ = auVar55._0_8_;
                  auVar43._12_4_ = auVar55._12_4_;
                }
                uVar14 = movmskps(iVar13,auVar43);
                uVar17 = CONCAT44((int)((ulong)local_11a0 >> 0x20),uVar14);
                unique0x00034580 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> unique0x00034580 & 1) == 0;
                      unique0x00034580 = unique0x00034580 + 1) {
                  }
                }
                pRVar8 = context->args;
                if ((pRVar8->filter != (RTCFilterFunctionN)0x0) ||
                   (((Geometry *)unique0x00012000)->intersectionFilterN != (RTCFilterFunctionN)0x0))
                {
                  local_1208._0_4_ = (ray->super_RayK<1>).tfar;
                  local_1208._4_4_ = (ray->super_RayK<1>).mask;
                  fStack_1200 = (float)(ray->super_RayK<1>).id;
                  fStack_11fc = (float)(ray->super_RayK<1>).flags;
                  local_11c8 = context->user;
                  _local_1218 = uVar19;
                  local_11f8 = (Geometry *)uVar25;
                  local_1138 = lVar23;
                  local_1148 = fVar109;
                  fStack_1144 = fVar114;
                  fStack_1140 = fVar123;
                  fStack_113c = fVar146;
                  local_1158 = fVar156;
                  fStack_1154 = 0.0;
                  local_11d8 = CONCAT44(fVar161,fVar131);
                  do {
                    local_111c = local_10a8[register0x00000008];
                    local_1118 = local_1098[register0x00000008];
                    (ray->super_RayK<1>).tfar = local_1088[register0x00000008];
                    local_1128 = local_1068[register0x00000008 + -4];
                    local_1124 = local_1068[register0x00000008];
                    local_1120 = local_1058[register0x00000008];
                    local_1114 = (float)(int)pRVar21;
                    local_1110 = (int)uVar16;
                    local_110c = local_11c8->instID[0];
                    local_1108 = local_11c8->instPrimID[0];
                    local_123c._0_4_ = -NAN;
                    local_1188.valid = (int *)local_123c;
                    local_1188.geometryUserPtr = *(void **)(stack0xffffffffffffedd8 + 0x18);
                    local_1188.context = local_11c8;
                    local_1188.ray = (RTCRayN *)ray;
                    local_1188.hit = (RTCHitN *)&local_1128;
                    local_1188.N = 1;
                    if (*(RTCFilterFunctionN *)(stack0xffffffffffffedd8 + 0x40) ==
                        (RTCFilterFunctionN)0x0) {
LAB_00d19784:
                      if ((pRVar8->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(stack0xffffffffffffedd8 + 0x3e) & 0x40) != 0)))) {
                        (*pRVar8->filter)(&local_1188);
                        uVar16 = CONCAT44(fStack_1154,local_1158);
                        pRVar21 = extraout_RDX_00;
                        ray = local_11e0;
                        lVar23 = local_1138;
                        uVar19 = _local_1218;
                        uVar25 = (ulong)local_11f8;
                        fVar109 = local_1148;
                        fVar114 = fStack_1144;
                        fVar123 = fStack_1140;
                        fVar146 = fStack_113c;
                        if (*local_1188.valid == 0) goto LAB_00d19848;
                      }
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1188.hit;
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1188.hit + 4);
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1188.hit + 8);
                      *(float *)((long)local_1188.ray + 0x3c) = *(float *)(local_1188.hit + 0xc);
                      *(float *)((long)local_1188.ray + 0x40) = *(float *)(local_1188.hit + 0x10);
                      *(float *)((long)local_1188.ray + 0x44) = *(float *)(local_1188.hit + 0x14);
                      *(float *)((long)local_1188.ray + 0x48) = *(float *)(local_1188.hit + 0x18);
                      pRVar21 = (RayQueryContext *)(ulong)(uint)*(float *)(local_1188.hit + 0x1c);
                      *(float *)((long)local_1188.ray + 0x4c) = *(float *)(local_1188.hit + 0x1c);
                      *(float *)((long)local_1188.ray + 0x50) = *(float *)(local_1188.hit + 0x20);
                    }
                    else {
                      (**(RTCFilterFunctionN *)(stack0xffffffffffffedd8 + 0x40))(&local_1188);
                      uVar16 = CONCAT44(fStack_1154,local_1158);
                      pRVar21 = extraout_RDX;
                      ray = local_11e0;
                      lVar23 = local_1138;
                      uVar19 = _local_1218;
                      uVar25 = (ulong)local_11f8;
                      fVar109 = local_1148;
                      fVar114 = fStack_1144;
                      fVar123 = fStack_1140;
                      fVar146 = fStack_113c;
                      if (*local_1188.valid != 0) goto LAB_00d19784;
LAB_00d19848:
                      (local_11e0->super_RayK<1>).tfar = (float)local_1208._0_4_;
                      ray = local_11e0;
                      lVar23 = local_1138;
                      uVar19 = _local_1218;
                      uVar25 = (ulong)local_11f8;
                      fVar109 = local_1148;
                      fVar114 = fStack_1144;
                      fVar123 = fStack_1140;
                      fVar146 = fStack_113c;
                    }
                    *(undefined4 *)(local_11b8 + stack0xffffffffffffedc8 * 4) = 0;
                    local_1208._0_4_ = (ray->super_RayK<1>).tfar;
                    local_1208._4_4_ = (ray->super_RayK<1>).mask;
                    fStack_1200 = (float)(ray->super_RayK<1>).id;
                    fStack_11fc = (float)(ray->super_RayK<1>).flags;
                    auVar47._0_4_ = -(uint)(fVar109 <= (float)local_1208._0_4_) & local_11b8._0_4_;
                    auVar47._4_4_ = -(uint)(fVar114 <= (float)local_1208._0_4_) & local_11b8._4_4_;
                    auVar47._8_4_ = -(uint)(fVar123 <= (float)local_1208._0_4_) & local_11b8._8_4_;
                    auVar47._12_4_ = -(uint)(fVar146 <= (float)local_1208._0_4_) & local_11b8._12_4_
                    ;
                    local_11b8 = auVar47;
                    iVar13 = movmskps((int)stack0xffffffffffffedc8,auVar47);
                    if (iVar13 == 0) goto LAB_00d18e81;
                    auVar60._0_4_ = auVar47._0_4_ & (uint)fVar109;
                    auVar60._4_4_ = auVar47._4_4_ & (uint)fVar114;
                    auVar60._8_4_ = auVar47._8_4_ & (uint)fVar123;
                    auVar60._12_4_ = auVar47._12_4_ & (uint)fVar146;
                    auVar75._0_8_ = CONCAT44(~auVar47._4_4_,~auVar47._0_4_) & 0x7f8000007f800000;
                    auVar75._8_4_ = ~auVar47._8_4_ & 0x7f800000;
                    auVar75._12_4_ = ~auVar47._12_4_ & 0x7f800000;
                    auVar75 = auVar75 | auVar60;
                    auVar86._4_4_ = auVar75._0_4_;
                    auVar86._0_4_ = auVar75._4_4_;
                    auVar86._8_4_ = auVar75._12_4_;
                    auVar86._12_4_ = auVar75._8_4_;
                    auVar92 = minps(auVar86,auVar75);
                    auVar61._0_8_ = auVar92._8_8_;
                    auVar61._8_4_ = auVar92._0_4_;
                    auVar61._12_4_ = auVar92._4_4_;
                    auVar92 = minps(auVar61,auVar92);
                    auVar62._0_8_ =
                         CONCAT44(-(uint)(auVar92._4_4_ == auVar75._4_4_) & auVar47._4_4_,
                                  -(uint)(auVar92._0_4_ == auVar75._0_4_) & auVar47._0_4_);
                    auVar62._8_4_ = -(uint)(auVar92._8_4_ == auVar75._8_4_) & auVar47._8_4_;
                    auVar62._12_4_ = -(uint)(auVar92._12_4_ == auVar75._12_4_) & auVar47._12_4_;
                    iVar13 = movmskps(iVar13,auVar62);
                    if (iVar13 != 0) {
                      auVar47._8_4_ = auVar62._8_4_;
                      auVar47._0_8_ = auVar62._0_8_;
                      auVar47._12_4_ = auVar62._12_4_;
                    }
                    uVar14 = movmskps(iVar13,auVar47);
                    uVar17 = CONCAT44((int)((ulong)stack0xffffffffffffedc8 >> 0x20),uVar14);
                    unique0x00034580 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> unique0x00034580 & 1) == 0;
                          unique0x00034580 = unique0x00034580 + 1) {
                      }
                    }
                    pRVar21 = (RayQueryContext *)(local_11d8 & 0xffffffff);
                  } while( true );
                }
                fVar109 = local_10a8[unique0x00034580];
                fVar114 = local_1098[unique0x00034580];
                fVar123 = local_1068[unique0x00034580 + -4];
                fVar146 = local_1068[unique0x00034580];
                fVar103 = local_1058[unique0x00034580];
                (ray->super_RayK<1>).tfar = local_1088[unique0x00034580];
                (ray->Ng).field_0.field_0.x = fVar123;
                (ray->Ng).field_0.field_0.y = fVar146;
                (ray->Ng).field_0.field_0.z = fVar103;
                ray->u = fVar109;
                ray->v = fVar114;
                ray->primID = (uint)fVar131;
                ray->geomID = (uint)fVar156;
                pRVar9 = context->user;
                ray->instID[0] = pRVar9->instID[0];
                ray->instPrimID[0] = pRVar9->instPrimID[0];
              }
            }
          }
LAB_00d18e81:
          if (2 < (uint)uVar25) {
            lVar23 = lVar23 + uVar19 * 4;
            local_11a0 = (float *)(lVar23 + 0x2c);
            uVar16 = (ulong)*(uint *)((long)&local_1248->args + 4);
            pfVar4 = local_11a0 + uVar16;
            pRVar21 = (RayQueryContext *)(local_11a0 + uVar16 * 2);
            local_1208._4_4_ = *(float *)(lVar23 + 0x30);
            pfVar5 = local_11a0 + uVar19;
            fVar156 = pfVar5[1];
            if (uVar19 == 2) {
              fVar131 = *pfVar4;
              fVar109 = pfVar4[1];
              fVar114 = pfVar4[2];
              fVar123 = pfVar4[3];
              fVar146 = *(float *)&pRVar21->scene;
              fVar103 = *(float *)((long)&pRVar21->scene + 4);
              fVar158 = *(float *)&pRVar21->user;
              fVar129 = *(float *)((long)&pRVar21->user + 4);
              fVar157 = fVar156;
              fVar124 = fVar123;
              fVar160 = fVar103;
              fVar130 = fVar129;
              fStack_11fc = (float)local_1208._4_4_;
              fVar112 = fVar109;
            }
            else {
              fVar131 = *pfVar4;
              fVar109 = pfVar4[1];
              pfVar1 = pfVar4 + uVar19;
              fVar114 = *pfVar1;
              fVar123 = pfVar1[1];
              fVar146 = *(float *)&pRVar21->scene;
              fVar103 = *(float *)((long)&pRVar21->scene + 4);
              pfVar2 = (float *)((long)&pRVar21->scene + uVar19 * 4);
              fVar158 = *pfVar2;
              fVar129 = pfVar2[1];
              fVar157 = pfVar5[2];
              fVar124 = pfVar1[2];
              fVar160 = *(float *)&pRVar21->user;
              fVar130 = pfVar2[2];
              fStack_11fc = *(float *)(lVar23 + 0x34);
              fVar112 = pfVar4[2];
            }
            fVar77 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar88 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar89 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_1028 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fStack_1234 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1224 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1148 = *local_11a0 - fVar77;
            fStack_1144 = *pfVar5 - fVar77;
            fStack_1140 = (float)local_1208._4_4_ - fVar77;
            fStack_113c = fVar156 - fVar77;
            fVar131 = fVar131 - fVar88;
            fVar136 = fVar114 - fVar88;
            fStack_11c0 = fVar109 - fVar88;
            fStack_11bc = fVar123 - fVar88;
            fVar146 = fVar146 - fVar89;
            fVar161 = fVar158 - fVar89;
            fStack_11d0 = fVar103 - fVar89;
            fStack_11cc = fVar129 - fVar89;
            local_1208._0_4_ = (float)local_1208._4_4_ - fVar77;
            local_1208._4_4_ = (float)local_1208._4_4_ - fVar77;
            fStack_1200 = fStack_11fc - fVar77;
            fStack_11fc = fStack_11fc - fVar77;
            fVar105 = fVar109 - fVar88;
            fVar109 = fVar109 - fVar88;
            fVar111 = fVar112 - fVar88;
            fVar112 = fVar112 - fVar88;
            fVar91 = fVar103 - fVar89;
            fVar103 = fVar103 - fVar89;
            fVar104 = fVar160 - fVar89;
            fVar160 = fVar160 - fVar89;
            fVar154 = *pfVar5 - fVar77;
            fVar155 = fVar156 - fVar77;
            fVar156 = fVar156 - fVar77;
            fVar157 = fVar157 - fVar77;
            fVar114 = fVar114 - fVar88;
            fVar122 = fVar123 - fVar88;
            fVar123 = fVar123 - fVar88;
            fVar124 = fVar124 - fVar88;
            fVar158 = fVar158 - fVar89;
            fVar149 = fVar129 - fVar89;
            fVar129 = fVar129 - fVar89;
            fVar130 = fVar130 - fVar89;
            fVar144 = fVar154 - local_1148;
            fVar147 = fVar155 - fStack_1144;
            fVar150 = fVar156 - fStack_1140;
            fVar152 = fVar157 - fStack_113c;
            fVar137 = fVar114 - fVar131;
            fVar143 = fVar122 - fVar136;
            fStack_1130 = fVar123 - fStack_11c0;
            fStack_112c = fVar124 - fStack_11bc;
            local_11f8._0_4_ = fVar158 - fVar146;
            local_11f8._4_4_ = fVar149 - fVar161;
            auStack_11f0[0] = (uint)(fVar129 - fStack_11d0);
            auStack_11ec[0] = (uint)(fVar130 - fStack_11cc);
            local_1138 = CONCAT44(fVar143,fVar137);
            auStack_1214._0_4_ = fVar147;
            local_1218 = (undefined1  [4])fVar144;
            auStack_1214._4_4_ = fVar150;
            fStack_120c = fVar152;
            auStack_122c._4_4_ = fStack_1224;
            uStack_1220 = fStack_1224;
            fStack_121c = fStack_1224;
            fVar77 = fVar131 - fVar105;
            fVar88 = fVar136 - fVar109;
            fVar89 = fStack_11c0 - fVar111;
            fVar90 = fStack_11bc - fVar112;
            fVar166 = (fVar137 * (fVar158 + fVar146) - (float)local_11f8 * (fVar114 + fVar131)) *
                      local_1028 +
                      ((float)local_11f8 * (fVar154 + local_1148) - (fVar158 + fVar146) * fVar144) *
                      fStack_1234 +
                      ((fVar114 + fVar131) * fVar144 - (fVar154 + local_1148) * fVar137) *
                      fStack_1224;
            fVar169 = (fVar143 * (fVar149 + fVar161) - local_11f8._4_4_ * (fVar122 + fVar136)) *
                      local_1028 +
                      (local_11f8._4_4_ * (fVar155 + fStack_1144) - (fVar149 + fVar161) * fVar147) *
                      fStack_1234 +
                      ((fVar122 + fVar136) * fVar147 - (fVar155 + fStack_1144) * fVar143) *
                      fStack_1224;
            _local_1218 = CONCAT44(fVar169,fVar166);
            auStack_1214._4_4_ =
                 (fStack_1130 * (fVar129 + fStack_11d0) -
                 (float)auStack_11f0[0] * (fVar123 + fStack_11c0)) * local_1028 +
                 ((float)auStack_11f0[0] * (fVar156 + fStack_1140) -
                 (fVar129 + fStack_11d0) * fVar150) * fStack_1234 +
                 ((fVar123 + fStack_11c0) * fVar150 - (fVar156 + fStack_1140) * fStack_1130) *
                 fStack_1224;
            fStack_120c = (fStack_112c * (fVar130 + fStack_11cc) -
                          (float)auStack_11ec[0] * (fVar124 + fStack_11bc)) * local_1028 +
                          ((float)auStack_11ec[0] * (fVar157 + fStack_113c) -
                          (fVar130 + fStack_11cc) * fVar152) * fStack_1234 +
                          ((fVar124 + fStack_11bc) * fVar152 - (fVar157 + fStack_113c) * fStack_112c
                          ) * fStack_1224;
            fVar145 = fVar146 - fVar91;
            fVar148 = fVar161 - fVar103;
            fVar151 = fStack_11d0 - fVar104;
            fVar153 = fStack_11cc - fVar160;
            local_11c8 = (RTCRayQueryContext *)CONCAT44(fVar136,fVar131);
            local_11d8 = CONCAT44(fVar161,fVar146);
            fVar106 = local_1148 - (float)local_1208._0_4_;
            fVar110 = fStack_1144 - (float)local_1208._4_4_;
            fVar163 = fStack_1140 - fStack_1200;
            fVar113 = fStack_113c - fStack_11fc;
            auVar134._0_4_ =
                 (fVar77 * (fVar146 + fVar91) - fVar145 * (fVar131 + fVar105)) * local_1028 +
                 (fVar145 * (local_1148 + (float)local_1208._0_4_) - (fVar146 + fVar91) * fVar106) *
                 fStack_1234 +
                 ((fVar131 + fVar105) * fVar106 - (local_1148 + (float)local_1208._0_4_) * fVar77) *
                 fStack_1224;
            auVar134._4_4_ =
                 (fVar88 * (fVar161 + fVar103) - fVar148 * (fVar136 + fVar109)) * local_1028 +
                 (fVar148 * (fStack_1144 + (float)local_1208._4_4_) - (fVar161 + fVar103) * fVar110)
                 * fStack_1234 +
                 ((fVar136 + fVar109) * fVar110 - (fStack_1144 + (float)local_1208._4_4_) * fVar88)
                 * fStack_1224;
            auVar134._8_4_ =
                 (fVar89 * (fStack_11d0 + fVar104) - fVar151 * (fStack_11c0 + fVar111)) * local_1028
                 + (fVar151 * (fStack_1140 + fStack_1200) - (fStack_11d0 + fVar104) * fVar163) *
                   fStack_1234 +
                   ((fStack_11c0 + fVar111) * fVar163 - (fStack_1140 + fStack_1200) * fVar89) *
                   fStack_1224;
            auVar134._12_4_ =
                 (fVar90 * (fStack_11cc + fVar160) - fVar153 * (fStack_11bc + fVar112)) * local_1028
                 + (fVar153 * (fStack_113c + fStack_11fc) - (fStack_11cc + fVar160) * fVar113) *
                   fStack_1234 +
                   ((fStack_11bc + fVar112) * fVar113 - (fStack_113c + fStack_11fc) * fVar90) *
                   fStack_1224;
            fVar138 = (float)local_1208._0_4_ - fVar154;
            fVar140 = (float)local_1208._4_4_ - fVar155;
            fVar141 = fStack_1200 - fVar156;
            fVar142 = fStack_11fc - fVar157;
            fVar159 = fVar105 - fVar114;
            fVar162 = fVar109 - fVar122;
            fVar164 = fVar111 - fVar123;
            fVar165 = fVar112 - fVar124;
            fVar125 = fVar91 - fVar158;
            fVar126 = fVar103 - fVar149;
            fVar127 = fVar104 - fVar129;
            fVar128 = fVar160 - fVar130;
            local_123c._4_4_ = fStack_1234;
            uStack_1230 = fStack_1234;
            auStack_122c._0_4_ = fStack_1234;
            auVar73._0_4_ =
                 (fVar159 * (fVar158 + fVar91) - fVar125 * (fVar114 + fVar105)) * local_1028 +
                 (fVar125 * (fVar154 + (float)local_1208._0_4_) - (fVar158 + fVar91) * fVar138) *
                 fStack_1234 +
                 ((fVar114 + fVar105) * fVar138 - (fVar154 + (float)local_1208._0_4_) * fVar159) *
                 fStack_1224;
            auVar73._4_4_ =
                 (fVar162 * (fVar149 + fVar103) - fVar126 * (fVar122 + fVar109)) * local_1028 +
                 (fVar126 * (fVar155 + (float)local_1208._4_4_) - (fVar149 + fVar103) * fVar140) *
                 fStack_1234 +
                 ((fVar122 + fVar109) * fVar140 - (fVar155 + (float)local_1208._4_4_) * fVar162) *
                 fStack_1224;
            auVar73._8_4_ =
                 (fVar164 * (fVar129 + fVar104) - fVar127 * (fVar123 + fVar111)) * local_1028 +
                 (fVar127 * (fVar156 + fStack_1200) - (fVar129 + fVar104) * fVar141) * fStack_1234 +
                 ((fVar123 + fVar111) * fVar141 - (fVar156 + fStack_1200) * fVar164) * fStack_1224;
            auVar73._12_4_ =
                 (fVar165 * (fVar130 + fVar160) - fVar128 * (fVar124 + fVar112)) * local_1028 +
                 (fVar128 * (fVar157 + fStack_11fc) - (fVar130 + fVar160) * fVar142) * fStack_1234 +
                 ((fVar124 + fVar112) * fVar142 - (fVar157 + fStack_11fc) * fVar165) * fStack_1224;
            local_1158 = fVar166 + auVar134._0_4_ + auVar73._0_4_;
            fStack_1154 = fVar169 + auVar134._4_4_ + auVar73._4_4_;
            fStack_1150 = (float)auStack_1214._4_4_ + auVar134._8_4_ + auVar73._8_4_;
            fStack_114c = fStack_120c + auVar134._12_4_ + auVar73._12_4_;
            auVar119._8_4_ = auStack_1214._4_4_;
            auVar119._0_8_ = _local_1218;
            auVar119._12_4_ = fStack_120c;
            auVar92 = minps(auVar119,auVar134);
            auVar67 = minps(auVar92,auVar73);
            auVar100._8_4_ = auStack_1214._4_4_;
            auVar100._0_8_ = _local_1218;
            auVar100._12_4_ = fStack_120c;
            auVar92 = maxps(auVar100,auVar134);
            auVar92 = maxps(auVar92,auVar73);
            local_1038 = ABS(local_1158);
            fStack_1034 = ABS(fStack_1154);
            fStack_1030 = ABS(fStack_1150);
            fStack_102c = ABS(fStack_114c);
            auVar101._4_4_ = -(uint)(auVar92._4_4_ <= fStack_1034 * 1.1920929e-07);
            auVar101._0_4_ = -(uint)(auVar92._0_4_ <= local_1038 * 1.1920929e-07);
            auVar101._8_4_ = -(uint)(auVar92._8_4_ <= fStack_1030 * 1.1920929e-07);
            auVar101._12_4_ = -(uint)(auVar92._12_4_ <= fStack_102c * 1.1920929e-07);
            auVar120._4_4_ = -(uint)(-(fStack_1034 * 1.1920929e-07) <= auVar67._4_4_);
            auVar120._0_4_ = -(uint)(-(local_1038 * 1.1920929e-07) <= auVar67._0_4_);
            auVar120._8_4_ = -(uint)(-(fStack_1030 * 1.1920929e-07) <= auVar67._8_4_);
            auVar120._12_4_ = -(uint)(-(fStack_102c * 1.1920929e-07) <= auVar67._12_4_);
            auVar101 = auVar101 | auVar120;
            local_11a0 = local_11a0 + uVar16 * 3;
            local_1198 = uVar19;
            local_1190 = uVar25;
            auVar102._0_4_ = auVar101._0_4_ & local_ff8;
            auVar102._4_4_ = auVar101._4_4_ & uStack_ff4;
            auVar102._8_4_ = auVar101._8_4_ & uStack_ff0;
            auVar102._12_4_ = auVar101._12_4_ & uStack_fec;
            iVar13 = movmskps((int)local_11a0,auVar102);
            if (iVar13 != 0) {
              _local_1208 = auVar134;
              fStack_1024 = local_1028;
              fStack_1020 = local_1028;
              fStack_101c = local_1028;
              uVar28 = -(uint)(ABS(fVar145 * fVar159) <= ABS((float)local_11f8 * fVar77));
              uVar36 = -(uint)(ABS(fVar148 * fVar162) <= ABS(local_11f8._4_4_ * fVar88));
              uVar33 = -(uint)(ABS(fVar151 * fVar164) <= ABS((float)auStack_11f0[0] * fVar89));
              uVar37 = -(uint)(ABS(fVar153 * fVar165) <= ABS((float)auStack_11ec[0] * fVar90));
              uVar29 = -(uint)(ABS(fVar106 * fVar125) <= ABS(fVar144 * fVar145));
              uVar30 = -(uint)(ABS(fVar110 * fVar126) <= ABS(fVar147 * fVar148));
              uVar34 = -(uint)(ABS(fVar163 * fVar127) <= ABS(fVar150 * fVar151));
              uVar38 = -(uint)(ABS(fVar113 * fVar128) <= ABS(fVar152 * fVar153));
              uVar32 = -(uint)(ABS(fVar77 * fVar138) <= ABS(fVar137 * fVar106));
              uVar31 = -(uint)(ABS(fVar88 * fVar140) <= ABS(fVar143 * fVar110));
              uVar35 = -(uint)(ABS(fVar89 * fVar141) <= ABS(fStack_1130 * fVar163));
              uVar39 = -(uint)(ABS(fVar90 * fVar142) <= ABS(fStack_112c * fVar113));
              auVar84._0_4_ = (uint)(fVar77 * fVar125 - fVar145 * fVar159) & uVar28;
              auVar84._4_4_ = (uint)(fVar88 * fVar126 - fVar148 * fVar162) & uVar36;
              auVar84._8_4_ = (uint)(fVar89 * fVar127 - fVar151 * fVar164) & uVar33;
              auVar84._12_4_ = (uint)(fVar90 * fVar128 - fVar153 * fVar165) & uVar37;
              auVar121._0_4_ = ~uVar28 & (uint)(fVar137 * fVar145 - (float)local_11f8 * fVar77);
              auVar121._4_4_ = ~uVar36 & (uint)(fVar143 * fVar148 - local_11f8._4_4_ * fVar88);
              auVar121._8_4_ =
                   ~uVar33 & (uint)(fStack_1130 * fVar151 - (float)auStack_11f0[0] * fVar89);
              auVar121._12_4_ =
                   ~uVar37 & (uint)(fStack_112c * fVar153 - (float)auStack_11ec[0] * fVar90);
              local_1078 = auVar121 | auVar84;
              local_1068[0] =
                   (float)(~uVar29 & (uint)((float)local_11f8 * fVar106 - fVar144 * fVar145) |
                          (uint)(fVar145 * fVar138 - fVar106 * fVar125) & uVar29);
              local_1068[1] =
                   (float)(~uVar30 & (uint)(local_11f8._4_4_ * fVar110 - fVar147 * fVar148) |
                          (uint)(fVar148 * fVar140 - fVar110 * fVar126) & uVar30);
              local_1068[2] =
                   (float)(~uVar34 & (uint)((float)auStack_11f0[0] * fVar163 - fVar150 * fVar151) |
                          (uint)(fVar151 * fVar141 - fVar163 * fVar127) & uVar34);
              local_1068[3] =
                   (float)(~uVar38 & (uint)((float)auStack_11ec[0] * fVar113 - fVar152 * fVar153) |
                          (uint)(fVar153 * fVar142 - fVar113 * fVar128) & uVar38);
              local_10d8._4_4_ = fStack_1154;
              local_10d8._0_4_ = local_1158;
              local_10d8._8_4_ = fStack_1150;
              local_10d8._12_4_ = fStack_114c;
              local_1058[0] =
                   (float)(~uVar32 & (uint)(fVar144 * fVar77 - fVar137 * fVar106) |
                          (uint)(fVar106 * fVar159 - fVar77 * fVar138) & uVar32);
              local_1058[1] =
                   (float)(~uVar31 & (uint)(fVar147 * fVar88 - fVar143 * fVar110) |
                          (uint)(fVar110 * fVar162 - fVar88 * fVar140) & uVar31);
              local_1058[2] =
                   (float)(~uVar35 & (uint)(fVar150 * fVar89 - fStack_1130 * fVar163) |
                          (uint)(fVar163 * fVar164 - fVar89 * fVar141) & uVar35);
              local_1058[3] =
                   (float)(~uVar39 & (uint)(fVar152 * fVar90 - fStack_112c * fVar113) |
                          (uint)(fVar113 * fVar165 - fVar90 * fVar142) & uVar39);
              fVar156 = local_1028 * local_1078._0_4_ +
                        fStack_1234 * local_1068[0] + fStack_1224 * local_1058[0];
              fVar109 = local_1028 * local_1078._4_4_ +
                        fStack_1234 * local_1068[1] + fStack_1224 * local_1058[1];
              fVar114 = local_1028 * local_1078._8_4_ +
                        fStack_1234 * local_1068[2] + fStack_1224 * local_1058[2];
              fVar123 = local_1028 * local_1078._12_4_ +
                        fStack_1234 * local_1068[3] + fStack_1224 * local_1058[3];
              auVar44._0_4_ = fVar156 + fVar156;
              auVar44._4_4_ = fVar109 + fVar109;
              auVar44._8_4_ = fVar114 + fVar114;
              auVar44._12_4_ = fVar123 + fVar123;
              auVar56._0_4_ = fVar131 * local_1068[0] + fVar146 * local_1058[0];
              auVar56._4_4_ = fVar136 * local_1068[1] + fVar161 * local_1058[1];
              auVar56._8_4_ = fStack_11c0 * local_1068[2] + fStack_11d0 * local_1058[2];
              auVar56._12_4_ = fStack_11bc * local_1068[3] + fStack_11cc * local_1058[3];
              fVar109 = local_1148 * local_1078._0_4_ + auVar56._0_4_;
              fVar114 = fStack_1144 * local_1078._4_4_ + auVar56._4_4_;
              fVar103 = fStack_1140 * local_1078._8_4_ + auVar56._8_4_;
              fVar158 = fStack_113c * local_1078._12_4_ + auVar56._12_4_;
              auVar92 = rcpps(auVar56,auVar44);
              fVar156 = auVar92._0_4_;
              fVar131 = auVar92._4_4_;
              fVar123 = auVar92._8_4_;
              fVar146 = auVar92._12_4_;
              fVar109 = ((1.0 - auVar44._0_4_ * fVar156) * fVar156 + fVar156) * (fVar109 + fVar109);
              fVar114 = ((1.0 - auVar44._4_4_ * fVar131) * fVar131 + fVar131) * (fVar114 + fVar114);
              fVar123 = ((1.0 - auVar44._8_4_ * fVar123) * fVar123 + fVar123) * (fVar103 + fVar103);
              fVar146 = ((1.0 - auVar44._12_4_ * fVar146) * fVar146 + fVar146) * (fVar158 + fVar158)
              ;
              fVar156 = (ray->super_RayK<1>).tfar;
              local_1258._0_4_ = (ray->super_RayK<1>).tfar;
              local_1258._4_4_ = (ray->super_RayK<1>).mask;
              local_1258._8_4_ = (ray->super_RayK<1>).id;
              local_1258._12_4_ = (ray->super_RayK<1>).flags;
              fVar131 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar45._0_4_ =
                   (int)((uint)(auVar44._0_4_ != 0.0 && (fVar109 <= fVar156 && fVar131 <= fVar109))
                        * -0x80000000) >> 0x1f;
              auVar45._4_4_ =
                   (int)((uint)(auVar44._4_4_ != 0.0 && (fVar114 <= fVar156 && fVar131 <= fVar114))
                        * -0x80000000) >> 0x1f;
              auVar45._8_4_ =
                   (int)((uint)(auVar44._8_4_ != 0.0 && (fVar123 <= fVar156 && fVar131 <= fVar123))
                        * -0x80000000) >> 0x1f;
              auVar45._12_4_ =
                   (int)((uint)(auVar44._12_4_ != 0.0 && (fVar146 <= fVar156 && fVar131 <= fVar146))
                        * -0x80000000) >> 0x1f;
              auVar46 = auVar45 & auVar102;
              iVar13 = movmskps(iVar13,auVar46);
              if (iVar13 != 0) {
                fVar156 = *(float *)&local_1248[1].scene;
                uVar16 = (ulong)(uint)fVar156;
                auVar24 = *(undefined1 (*) [4])((long)&local_1248[1].scene + 4);
                local_10f8._8_4_ = auStack_1214._4_4_;
                local_10f8._0_8_ = _local_1218;
                fStack_10ec = fStack_120c;
                local_10e8 = auVar134._0_4_;
                fStack_10e4 = auVar134._4_4_;
                fStack_10e0 = auVar134._8_4_;
                fStack_10dc = auVar134._12_4_;
                local_10c8 = &local_11a0;
                local_10b8 = auVar46;
                local_1088[0] = fVar109;
                local_1088[1] = fVar114;
                local_1088[2] = fVar123;
                local_1088[3] = fVar146;
                pGVar26 = (context->scene->geometries).items[uVar16].ptr;
                if ((pGVar26->mask & (ray->super_RayK<1>).mask) != 0) {
                  local_11b8 = auVar46;
                  fVar131 = local_11a0[1];
                  pfVar4 = local_11a0 + uVar19;
                  fVar103 = *pfVar4;
                  fVar158 = pfVar4[1];
                  fVar129 = local_11a0[2];
                  fVar157 = pfVar4[2];
                  if (uVar19 == 2) {
                    fVar129 = fVar131;
                    fVar157 = fVar158;
                  }
                  auVar92 = rcpps(auVar84,local_10d8);
                  fVar124 = auVar92._0_4_;
                  fVar160 = auVar92._4_4_;
                  fVar130 = auVar92._8_4_;
                  fVar112 = auVar92._12_4_;
                  fVar124 = (float)(-(uint)(1e-18 <= local_1038) &
                                   (uint)(((float)DAT_01f7ba10 - local_1158 * fVar124) * fVar124 +
                                         fVar124));
                  fVar160 = (float)(-(uint)(1e-18 <= fStack_1034) &
                                   (uint)((DAT_01f7ba10._4_4_ - fStack_1154 * fVar160) * fVar160 +
                                         fVar160));
                  fVar130 = (float)(-(uint)(1e-18 <= fStack_1030) &
                                   (uint)((DAT_01f7ba10._8_4_ - fStack_1150 * fVar130) * fVar130 +
                                         fVar130));
                  fVar112 = (float)(-(uint)(1e-18 <= fStack_102c) &
                                   (uint)((DAT_01f7ba10._12_4_ - fStack_114c * fVar112) * fVar112 +
                                         fVar112));
                  auVar168._0_4_ = fVar166 * fVar124;
                  auVar168._4_4_ = fVar169 * fVar160;
                  auVar168._8_4_ = (float)auStack_1214._4_4_ * fVar130;
                  auVar168._12_4_ = fStack_120c * fVar112;
                  auVar67 = minps(auVar168,_DAT_01f7ba10);
                  auVar135._0_4_ = auVar134._0_4_ * fVar124;
                  auVar135._4_4_ = auVar134._4_4_ * fVar160;
                  auVar135._8_4_ = auVar134._8_4_ * fVar130;
                  auVar135._12_4_ = auVar134._12_4_ * fVar112;
                  auVar92 = minps(auVar135,_DAT_01f7ba10);
                  fVar91 = auVar67._0_4_;
                  fVar104 = auVar67._4_4_;
                  fVar105 = auVar67._8_4_;
                  fVar106 = auVar67._12_4_;
                  fVar77 = auVar92._0_4_;
                  fVar88 = auVar92._4_4_;
                  fVar89 = auVar92._8_4_;
                  fVar90 = auVar92._12_4_;
                  fVar124 = ((float)DAT_01f7ba10 - fVar91) - fVar77;
                  fVar160 = (DAT_01f7ba10._4_4_ - fVar104) - fVar88;
                  fVar130 = (DAT_01f7ba10._8_4_ - fVar105) - fVar89;
                  fVar112 = (DAT_01f7ba10._12_4_ - fVar106) - fVar90;
                  local_10a8[0] =
                       (float)((uint)*local_11a0 & 0xffff) * 0.00012207031 * fVar124 +
                       (float)((uint)fVar103 & 0xffff) * 0.00012207031 * fVar77 +
                       (float)((uint)fVar131 & 0xffff) * 0.00012207031 * fVar91;
                  local_10a8[1] =
                       (float)((uint)fVar103 & 0xffff) * 0.00012207031 * fVar160 +
                       (float)((uint)fVar158 & 0xffff) * 0.00012207031 * fVar88 +
                       (float)((uint)fVar131 & 0xffff) * 0.00012207031 * fVar104;
                  local_10a8[2] =
                       (float)((uint)fVar131 & 0xffff) * 0.00012207031 * fVar130 +
                       (float)((uint)fVar158 & 0xffff) * 0.00012207031 * fVar89 +
                       (float)((uint)fVar129 & 0xffff) * 0.00012207031 * fVar105;
                  local_10a8[3] =
                       (float)((uint)fVar158 & 0xffff) * 0.00012207031 * fVar112 +
                       (float)((uint)fVar157 & 0xffff) * 0.00012207031 * fVar90 +
                       (float)((uint)fVar129 & 0xffff) * 0.00012207031 * fVar106;
                  local_1098[0] =
                       fVar124 * (float)((uint)*local_11a0 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar103 >> 0x10) * 0.00012207031 * fVar77 +
                       (float)((uint)fVar131 >> 0x10) * 0.00012207031 * fVar91;
                  local_1098[1] =
                       fVar160 * (float)((uint)fVar103 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar158 >> 0x10) * 0.00012207031 * fVar88 +
                       (float)((uint)fVar131 >> 0x10) * 0.00012207031 * fVar104;
                  local_1098[2] =
                       fVar130 * (float)((uint)fVar131 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar158 >> 0x10) * 0.00012207031 * fVar89 +
                       (float)((uint)fVar129 >> 0x10) * 0.00012207031 * fVar105;
                  local_1098[3] =
                       fVar112 * (float)((uint)fVar158 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar157 >> 0x10) * 0.00012207031 * fVar90 +
                       (float)((uint)fVar129 >> 0x10) * 0.00012207031 * fVar106;
                  uVar28 = auVar46._0_4_;
                  uVar29 = auVar46._4_4_;
                  uVar32 = auVar46._8_4_;
                  uVar36 = auVar46._12_4_;
                  auVar57._0_4_ = uVar28 & (uint)fVar109;
                  auVar57._4_4_ = uVar29 & (uint)fVar114;
                  auVar57._8_4_ = uVar32 & (uint)fVar123;
                  auVar57._12_4_ = uVar36 & (uint)fVar146;
                  auVar74._0_8_ = CONCAT44(~uVar29,~uVar28) & 0x7f8000007f800000;
                  auVar74._8_4_ = ~uVar32 & 0x7f800000;
                  auVar74._12_4_ = ~uVar36 & 0x7f800000;
                  auVar74 = auVar74 | auVar57;
                  auVar85._4_4_ = auVar74._0_4_;
                  auVar85._0_4_ = auVar74._4_4_;
                  auVar85._8_4_ = auVar74._12_4_;
                  auVar85._12_4_ = auVar74._8_4_;
                  auVar92 = minps(auVar85,auVar74);
                  auVar58._0_8_ = auVar92._8_8_;
                  auVar58._8_4_ = auVar92._0_4_;
                  auVar58._12_4_ = auVar92._4_4_;
                  auVar92 = minps(auVar58,auVar92);
                  auVar59._0_8_ =
                       CONCAT44(-(uint)(auVar92._4_4_ == auVar74._4_4_) & uVar29,
                                -(uint)(auVar92._0_4_ == auVar74._0_4_) & uVar28);
                  auVar59._8_4_ = -(uint)(auVar92._8_4_ == auVar74._8_4_) & uVar32;
                  auVar59._12_4_ = -(uint)(auVar92._12_4_ == auVar74._12_4_) & uVar36;
                  iVar13 = movmskps((int)local_11a0,auVar59);
                  if (iVar13 != 0) {
                    auVar46._8_4_ = auVar59._8_4_;
                    auVar46._0_8_ = auVar59._0_8_;
                    auVar46._12_4_ = auVar59._12_4_;
                  }
                  uVar14 = movmskps(iVar13,auVar46);
                  uVar19 = CONCAT44((int)((ulong)local_11a0 >> 0x20),uVar14);
                  unique0x00034580 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> unique0x00034580 & 1) == 0;
                        unique0x00034580 = unique0x00034580 + 1) {
                    }
                  }
                  stack0xffffffffffffedc8 = context->args;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar131 = local_10a8[unique0x00034580];
                    fVar109 = local_1098[unique0x00034580];
                    fVar114 = local_1068[unique0x00034580 + -4];
                    fVar123 = local_1068[unique0x00034580];
                    fVar146 = local_1058[unique0x00034580];
                    (ray->super_RayK<1>).tfar = local_1088[unique0x00034580];
                    (ray->Ng).field_0.field_0.x = fVar114;
                    (ray->Ng).field_0.field_0.y = fVar123;
                    (ray->Ng).field_0.field_0.z = fVar146;
                    ray->u = fVar131;
                    ray->v = fVar109;
                    ray->primID = (uint)auVar24;
                    ray->geomID = (uint)fVar156;
                    pRVar9 = context->user;
                    ray->instID[0] = pRVar9->instID[0];
                    ray->instPrimID[0] = pRVar9->instPrimID[0];
                  }
                  else {
                    _fStack_1200 = auVar134._8_8_;
                    local_1208 = (undefined1  [8])context->user;
                    local_11c8._0_4_ = fVar109;
                    local_11c8._4_4_ = fVar114;
                    fStack_11c0 = fVar123;
                    fStack_11bc = fVar146;
                    local_11d8 = uVar16;
                    local_1218 = auVar24;
                    local_11f8 = pGVar26;
LAB_00d1990e:
                    local_111c = local_10a8[register0x00000098];
                    local_1118 = local_1098[register0x00000098];
                    (ray->super_RayK<1>).tfar = local_1088[register0x00000098];
                    local_1128 = local_1068[register0x00000098 + -4];
                    local_1124 = local_1068[register0x00000098];
                    local_1120 = local_1058[register0x00000098];
                    local_1114 = (float)auVar24;
                    local_1110 = (int)uVar16;
                    local_110c = *(undefined4 *)local_1208;
                    local_1108 = *(uint *)((long)local_1208 + 4);
                    local_123c._0_4_ = -NAN;
                    local_1188.valid = (int *)local_123c;
                    local_1188.geometryUserPtr = pGVar26->userPtr;
                    local_1188.context = (RTCRayQueryContext *)local_1208;
                    local_1188.ray = (RTCRayN *)ray;
                    local_1188.hit = (RTCHitN *)&local_1128;
                    local_1188.N = 1;
                    if (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00d19a44:
                      if ((*(RTCFilterFunctionN *)(stack0xffffffffffffedc8 + 0x10) !=
                           (RTCFilterFunctionN)0x0) &&
                         (((*(byte *)stack0xffffffffffffedc8 & 2) != 0 ||
                          (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                        (**(RTCFilterFunctionN *)(stack0xffffffffffffedc8 + 0x10))(&local_1188);
                        pRVar21 = extraout_RDX_02;
                        ray = local_11e0;
                        uVar16 = local_11d8;
                        pGVar26 = local_11f8;
                        fVar109 = (float)local_11c8;
                        fVar114 = local_11c8._4_4_;
                        fVar123 = fStack_11c0;
                        fVar146 = fStack_11bc;
                        auVar24 = local_1218;
                        if ((((RayK<1> *)local_1188.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00d19b01;
                      }
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1188.hit;
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1188.hit + 4);
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1188.hit + 8);
                      *(float *)((long)local_1188.ray + 0x3c) = *(float *)(local_1188.hit + 0xc);
                      *(float *)((long)local_1188.ray + 0x40) = *(float *)(local_1188.hit + 0x10);
                      *(float *)((long)local_1188.ray + 0x44) = *(float *)(local_1188.hit + 0x14);
                      *(float *)((long)local_1188.ray + 0x48) = *(float *)(local_1188.hit + 0x18);
                      pRVar21 = (RayQueryContext *)(ulong)(uint)*(float *)(local_1188.hit + 0x1c);
                      *(float *)((long)local_1188.ray + 0x4c) = *(float *)(local_1188.hit + 0x1c);
                      *(float *)((long)local_1188.ray + 0x50) = *(float *)(local_1188.hit + 0x20);
                      pRVar18 = (RayHit *)local_1188.ray;
                    }
                    else {
                      (*pGVar26->intersectionFilterN)(&local_1188);
                      pRVar21 = extraout_RDX_01;
                      ray = local_11e0;
                      uVar16 = local_11d8;
                      pGVar26 = local_11f8;
                      fVar109 = (float)local_11c8;
                      fVar114 = local_11c8._4_4_;
                      fVar123 = fStack_11c0;
                      fVar146 = fStack_11bc;
                      auVar24 = local_1218;
                      if ((((RayK<1> *)local_1188.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00d19a44;
LAB_00d19b01:
                      (local_11e0->super_RayK<1>).tfar = (float)local_1258._0_4_;
                      pRVar18 = (RayHit *)local_1188.valid;
                      ray = local_11e0;
                      uVar16 = local_11d8;
                      pGVar26 = local_11f8;
                      fVar109 = (float)local_11c8;
                      fVar114 = local_11c8._4_4_;
                      fVar123 = fStack_11c0;
                      fVar146 = fStack_11bc;
                      auVar24 = local_1218;
                    }
                    *(undefined4 *)(local_11b8 + register0x00000098 * 4) = 0;
                    local_1258._0_4_ = (ray->super_RayK<1>).tfar;
                    local_1258._4_4_ = (ray->super_RayK<1>).mask;
                    local_1258._8_4_ = (ray->super_RayK<1>).id;
                    local_1258._12_4_ = (ray->super_RayK<1>).flags;
                    auVar48._0_4_ = -(uint)(fVar109 <= (float)local_1258._0_4_) & local_11b8._0_4_;
                    auVar48._4_4_ = -(uint)(fVar114 <= (float)local_1258._0_4_) & local_11b8._4_4_;
                    auVar48._8_4_ = -(uint)(fVar123 <= (float)local_1258._0_4_) & local_11b8._8_4_;
                    auVar48._12_4_ = -(uint)(fVar146 <= (float)local_1258._0_4_) & local_11b8._12_4_
                    ;
                    local_11b8 = auVar48;
                    iVar13 = movmskps((int)pRVar18,auVar48);
                    if (iVar13 != 0) {
                      auVar63._0_4_ = auVar48._0_4_ & (uint)fVar109;
                      auVar63._4_4_ = auVar48._4_4_ & (uint)fVar114;
                      auVar63._8_4_ = auVar48._8_4_ & (uint)fVar123;
                      auVar63._12_4_ = auVar48._12_4_ & (uint)fVar146;
                      auVar76._0_8_ = CONCAT44(~auVar48._4_4_,~auVar48._0_4_) & 0x7f8000007f800000;
                      auVar76._8_4_ = ~auVar48._8_4_ & 0x7f800000;
                      auVar76._12_4_ = ~auVar48._12_4_ & 0x7f800000;
                      auVar76 = auVar76 | auVar63;
                      auVar87._4_4_ = auVar76._0_4_;
                      auVar87._0_4_ = auVar76._4_4_;
                      auVar87._8_4_ = auVar76._12_4_;
                      auVar87._12_4_ = auVar76._8_4_;
                      auVar92 = minps(auVar87,auVar76);
                      auVar64._0_8_ = auVar92._8_8_;
                      auVar64._8_4_ = auVar92._0_4_;
                      auVar64._12_4_ = auVar92._4_4_;
                      auVar92 = minps(auVar64,auVar92);
                      auVar65._0_8_ =
                           CONCAT44(-(uint)(auVar92._4_4_ == auVar76._4_4_) & auVar48._4_4_,
                                    -(uint)(auVar92._0_4_ == auVar76._0_4_) & auVar48._0_4_);
                      auVar65._8_4_ = -(uint)(auVar92._8_4_ == auVar76._8_4_) & auVar48._8_4_;
                      auVar65._12_4_ = -(uint)(auVar92._12_4_ == auVar76._12_4_) & auVar48._12_4_;
                      iVar13 = movmskps(iVar13,auVar65);
                      if (iVar13 != 0) {
                        auVar48._8_4_ = auVar65._8_4_;
                        auVar48._0_8_ = auVar65._0_8_;
                        auVar48._12_4_ = auVar65._12_4_;
                      }
                      uVar14 = movmskps(iVar13,auVar48);
                      uVar19 = CONCAT44((int)((ulong)pRVar18 >> 0x20),uVar14);
                      unique0x00034580 = 0;
                      if (uVar19 != 0) {
                        for (; (uVar19 >> unique0x00034580 & 1) == 0;
                            unique0x00034580 = unique0x00034580 + 1) {
                        }
                      }
                      goto LAB_00d1990e;
                    }
                  }
                }
              }
            }
          }
          fVar156 = (ray->super_RayK<1>).tfar;
          auVar40._4_4_ = fVar156;
          auVar40._0_4_ = fVar156;
          auVar40._8_4_ = fVar156;
          auVar40._12_4_ = fVar156;
          fVar88 = local_fc8;
          fVar89 = fStack_fc4;
          fVar90 = fStack_fc0;
          fVar109 = fStack_fbc;
          auVar139 = local_f98;
          fVar91 = local_fd8;
          fVar104 = fStack_fd4;
          fVar105 = fStack_fd0;
          fVar114 = fStack_fcc;
          fVar106 = local_fb8;
          fVar110 = fStack_fb4;
          fVar111 = fStack_fb0;
          fVar163 = fStack_fac;
          fVar146 = local_1048;
          fVar156 = fStack_1044;
          fVar131 = fStack_1040;
          fVar103 = fStack_103c;
          fVar158 = local_1008;
          fVar129 = fStack_1004;
          fVar157 = fStack_1000;
          fVar124 = fStack_ffc;
          fVar160 = local_1018;
          fVar130 = fStack_1014;
          fVar112 = fStack_1010;
          fVar77 = fStack_100c;
          fVar113 = local_f88;
          fVar122 = fStack_f84;
          fVar125 = fStack_f80;
          fVar123 = fStack_f7c;
          fVar126 = local_fa8;
          fVar127 = fStack_fa4;
          fVar128 = fStack_fa0;
          fVar149 = fStack_f9c;
          fVar136 = local_fe8;
          fVar137 = fStack_fe4;
          fVar138 = fStack_fe0;
          fVar143 = fStack_fdc;
        }
        else {
          pRVar21 = (RayQueryContext *)((ulong)pRVar20 & 0xfffffffffffffff0);
          lVar11 = *(long *)((long)&pRVar21[2].scene + (ulong)*(uint *)((long)&pRVar21[1].args + 4))
          ;
          fVar140 = (ray->super_RayK<1>).tfar;
          auVar40._4_4_ = fVar140;
          auVar40._0_4_ = fVar140;
          auVar40._8_4_ = fVar140;
          auVar40._12_4_ = fVar140;
          local_1248 = pRVar21;
          if (lVar11 != 0) {
            *(long *)*pauVar15 = lVar11;
            *(undefined4 *)((long)*pauVar15 + 8) = 0;
            pauVar15 = pauVar15 + 1;
          }
        }
      }
    } while (pauVar15 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }